

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O0

void __thiscall
cmEventBasedConnection::cmEventBasedConnection
          (cmEventBasedConnection *this,cmConnectionBufferStrategy *bufferStrategy)

{
  cmConnectionBufferStrategy *bufferStrategy_local;
  cmEventBasedConnection *this_local;
  
  cmConnection::cmConnection(&this->super_cmConnection);
  (this->super_cmConnection)._vptr_cmConnection = (_func_int **)&PTR_WriteData_00cc4f78;
  this->ReadStream = (uv_stream_t *)0x0;
  this->WriteStream = (uv_stream_t *)0x0;
  std::__cxx11::string::string((string *)&this->RawReadBuffer);
  std::unique_ptr<cmConnectionBufferStrategy,std::default_delete<cmConnectionBufferStrategy>>::
  unique_ptr<std::default_delete<cmConnectionBufferStrategy>,void>
            ((unique_ptr<cmConnectionBufferStrategy,std::default_delete<cmConnectionBufferStrategy>>
              *)&this->BufferStrategy,bufferStrategy);
  return;
}

Assistant:

cmEventBasedConnection::cmEventBasedConnection(
  cmConnectionBufferStrategy* bufferStrategy)
  : BufferStrategy(bufferStrategy)
{
}